

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O2

longdouble * __thiscall
trng::math::detail::GammaP_ser<long_double,true>
          (longdouble *__return_storage_ptr__,detail *this,longdouble a,longdouble x)

{
  uint uVar1;
  longdouble *in_RAX;
  bool bVar2;
  longdouble lVar3;
  longdouble lVar4;
  
  if ((longdouble)4.3368087e-19 <= x) {
    lVar3 = (longdouble)1 / a;
    lVar4 = lVar3;
    uVar1 = 0;
    do {
      a = a + (longdouble)1;
      lVar4 = (x / a) * lVar4;
      lVar3 = lVar3 + lVar4;
      if (ABS(lVar4) <= ABS(lVar3) * (longdouble)4.3368087e-19) break;
      bVar2 = uVar1 < 0x3f;
      uVar1 = uVar1 + 1;
    } while (bVar2);
    logl();
    lgammal();
    in_RAX = (longdouble *)expl();
  }
  return in_RAX;
}

Assistant:

TRNG_CUDA_ENABLE T GammaP_ser(T a, T x) {
        const int itmax{numeric_limits<T>::digits};
        const T eps{4 * numeric_limits<T>::epsilon()};
        if (x < eps)
          return T{0};
        T xx{1 / a}, n{a}, sum{xx};
        int i{0};
        do {
          ++n;
          ++i;
          xx *= x / n;
          sum += xx;
        } while (abs(xx) > eps * abs(sum) and i < itmax);
#if __cplusplus >= 201703L
        if constexpr (by_Gamma_a)
#else
        if (by_Gamma_a)
#endif
          return exp(-x + a * ln(x) - ln_Gamma(a)) * sum;
        else
          return exp(-x + a * ln(x)) * sum;
      }